

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

bool BaseMap_Read(TFileStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,DWORD dwBytesToRead)

{
  ULONGLONG *pUVar1;
  ulong __n;
  
  pUVar1 = &(pStream->Base).File.FilePos;
  if (pByteOffset == (ULONGLONG *)0x0) {
    pByteOffset = pUVar1;
  }
  if (dwBytesToRead == 0) {
    __n = 0;
  }
  else {
    __n = (ulong)dwBytesToRead;
    if ((pStream->Base).File.FileSize < *pByteOffset + __n) {
      return false;
    }
    memcpy(pvBuffer,(void *)(*pByteOffset + (long)(pStream->Base).File.hFile),__n);
  }
  *pUVar1 = *pUVar1 + __n;
  return true;
}

Assistant:

static bool BaseMap_Read(
    TFileStream * pStream,                  // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG ByteOffset = (pByteOffset != NULL) ? *pByteOffset : pStream->Base.Map.FilePos;

    // Do we have to read anything at all?
    if(dwBytesToRead != 0)
    {
        // Don't allow reading past file size
        if((ByteOffset + dwBytesToRead) > pStream->Base.Map.FileSize)
            return false;

        // Copy the required data
        memcpy(pvBuffer, pStream->Base.Map.pbFile + (size_t)ByteOffset, dwBytesToRead);
    }

    // Move the current file position
    pStream->Base.Map.FilePos += dwBytesToRead;
    return true;
}